

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O2

void __thiscall libDAI::JTree::runHUGIN(JTree *this)

{
  long lVar1;
  pointer pTVar2;
  pointer pDVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar5;
  size_t alpha;
  ulong uVar6;
  long lVar7;
  size_t beta;
  long lVar8;
  bool bVar9;
  double dVar10;
  long local_b0;
  Factor new_Qb;
  TFactor<double> local_68;
  
  lVar7 = 0;
  lVar8 = 0;
  uVar6 = 0;
  while( true ) {
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var,iVar4) + 0xe8) -
                *(long *)(CONCAT44(extraout_var,iVar4) + 0xe0) >> 6) <= uVar6) break;
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(((this->_Qa).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8),
               (TFactor<double> *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0xe0) + lVar7));
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 0x38;
    lVar7 = lVar7 + 0x40;
  }
  lVar7 = 0x20;
  uVar6 = 0;
  while( true ) {
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)((*(long *)(CONCAT44(extraout_var_01,iVar4) + 0x100) -
                *(long *)(CONCAT44(extraout_var_01,iVar4) + 0xf8)) / 0x28) <= uVar6) break;
    TProb<double>::fill((TProb<double> *)
                        ((long)&(((this->_Qb).
                                  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar7),1.0);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x38;
  }
  this->_logZ = 0.0;
  lVar5 = (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar8 = lVar5 >> 4;
  local_b0 = lVar8 * 0x28;
  lVar7 = lVar8 * 0x38;
  while( true ) {
    local_b0 = local_b0 + -0x28;
    bVar9 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar9) break;
    lVar1 = *(long *)((long)(this->_RTree).
                            super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar5 + -8);
    pTVar2 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::partSum
              (&new_Qb,pTVar2 + lVar1,
               (VarSet *)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0xf8) + local_b0));
    dVar10 = TProb<double>::normalize(&new_Qb._p,NORMPROB);
    dVar10 = log(dVar10);
    this->_logZ = dVar10 + this->_logZ;
    TFactor<double>::divided_by
              (&local_68,&new_Qb,
               (TFactor<double> *)
               ((long)&(this->_Qb).
                       super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1]._vs._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    TFactor<double>::operator*=
              ((this->_Qa).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)((long)&(this->_RTree).
                                super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                _M_impl.super__Vector_impl_data._M_start[-1].n1 + lVar5),&local_68);
    TFactor<double>::~TFactor(&local_68);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(this->_Qb).
                       super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1]._vs._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7),&new_Qb);
    TFactor<double>::~TFactor(&new_Qb);
    lVar5 = lVar5 + -0x10;
    lVar7 = lVar7 + -0x38;
  }
  pDVar3 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pDVar3 == (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pTVar2 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pTVar2 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + pDVar3->n1;
  }
  local_b0 = 0;
  dVar10 = TProb<double>::normalize(&pTVar2->_p,NORMPROB);
  dVar10 = log(dVar10);
  lVar7 = 0;
  lVar8 = 0;
  uVar6 = 0;
  this->_logZ = dVar10 + this->_logZ;
  while( true ) {
    pDVar3 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_RTree).
                      super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pDVar3 >> 4) <= uVar6) break;
    lVar5 = *(long *)((long)&pDVar3->n1 + lVar8);
    pTVar2 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::marginal
              (&new_Qb,pTVar2 + lVar5,
               (VarSet *)(*(long *)(CONCAT44(extraout_var_03,iVar4) + 0xf8) + local_b0),true);
    TFactor<double>::divided_by
              (&local_68,&new_Qb,
               (TFactor<double> *)
               ((long)&(((this->_Qb).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7));
    TFactor<double>::operator*=
              ((this->_Qa).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)((long)&((this->_RTree).
                                 super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->n2 + lVar8),&local_68);
    TFactor<double>::~TFactor(&local_68);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(((this->_Qb).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7),&new_Qb);
    TFactor<double>::~TFactor(&new_Qb);
    local_b0 = local_b0 + 0x28;
    lVar8 = lVar8 + 0x10;
    lVar7 = lVar7 + 0x38;
    uVar6 = uVar6 + 1;
  }
  lVar7 = 0x20;
  uVar6 = 0;
  while( true ) {
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_04,iVar4) + 0xe8) -
                *(long *)(CONCAT44(extraout_var_04,iVar4) + 0xe0) >> 6) <= uVar6) break;
    TProb<double>::normalize
              ((TProb<double> *)
               ((long)&(((this->_Qa).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7),NORMPROB);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x38;
  }
  return;
}

Assistant:

void JTree::runHUGIN() {
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa[alpha] = grm().OR(alpha);

        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            _Qb[beta].fill( 1.0 );

        // CollectEvidence
        _logZ = 0.0;
        for( size_t i = _RTree.size(); (i--) != 0; ) {
    //      Make outer region _RTree[i].n1 consistent with outer region _RTree[i].n2
    //      IR(i) = seperator OR(_RTree[i].n1) && OR(_RTree[i].n2)
            Factor new_Qb = _Qa[_RTree[i].n2].partSum( grm().IR( i ) );
            _logZ += log(new_Qb.normalize());
            _Qa[_RTree[i].n1] *= new_Qb.divided_by( _Qb[i] ); 
            _Qb[i] = new_Qb;
        }
        if( _RTree.empty() )
            _logZ += log(_Qa[0].normalize() );
        else
            _logZ += log(_Qa[_RTree[0].n1].normalize());

        // DistributeEvidence
        for( size_t i = 0; i < _RTree.size(); i++ ) {
    //      Make outer region _RTree[i].n2 consistent with outer region _RTree[i].n1
    //      IR(i) = seperator OR(_RTree[i].n1) && OR(_RTree[i].n2)
            Factor new_Qb = _Qa[_RTree[i].n1].marginal( grm().IR( i ) );
            _Qa[_RTree[i].n2] *= new_Qb.divided_by( _Qb[i] ); 
            _Qb[i] = new_Qb;
        }

        // Normalize
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa[alpha].normalize();
    }